

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_option.c
# Opt level: O0

int mpt_parse_option(mpt_parser_format *fmt,mpt_parser_context *parse,mpt_path *path)

{
  uint8_t uVar1;
  int iVar2;
  ushort **ppuVar3;
  uint local_2c;
  int curr;
  mpt_path *path_local;
  mpt_parser_context *parse_local;
  mpt_parser_format *fmt_local;
  
  local_2c = mpt_parse_nextvis(&parse->src,fmt->com,4);
  if ((int)local_2c < 0) {
    uVar1 = '\x03';
    if (parse->valid != 0) {
      uVar1 = '\v';
    }
    parse->curr = uVar1;
    if (local_2c == 0xfffffffe) {
      fmt_local._4_4_ = 0;
      if (path->len != 0) {
        fmt_local._4_4_ = -0x10;
      }
    }
    else {
      fmt_local._4_4_ = -1;
    }
  }
  else if (((fmt->ostart == '\0') || (local_2c == fmt->ostart)) || (parse->valid == 0)) {
    iVar2 = mpt_path_addchar(path,local_2c);
    if (iVar2 < 0) {
      parse->curr = '\v';
      fmt_local._4_4_ = -0x11;
    }
    else {
      parse->curr = '\v';
      do {
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)local_2c] & 0x2000) == 0) {
          if (local_2c == fmt->assign) {
            iVar2 = mpt_parse_ncheck(path->base + path->len + path->off,(ulong)parse->valid,
                                     (uint)(parse->name).opt);
            if (iVar2 < 0) {
              return -3;
            }
            iVar2 = mpt_path_add(path,(uint)parse->valid);
            if (iVar2 < 0) {
              return -0x11;
            }
            mpt_path_invalidate(path);
            parse->valid = 0;
            iVar2 = mpt_parse_data(fmt,parse,path);
            if (iVar2 < 0) {
              return iVar2;
            }
            if (iVar2 == 0) {
              return 3;
            }
            return 7;
          }
          if (local_2c == fmt->oend) {
LAB_00126cd0:
            parse->curr = '\x04';
            if (((parse->name).opt & 0x10) == 0) {
              return -3;
            }
            return 4;
          }
          if ((local_2c != 0) &&
             (((local_2c == fmt->com[0] || (local_2c == fmt->com[1])) ||
              ((local_2c == fmt->com[2] || (local_2c == fmt->com[3])))))) {
            if (fmt->oend != '\0') {
              return -2;
            }
            mpt_parse_endline(&parse->src);
            goto LAB_00126cd0;
          }
          iVar2 = mpt_path_valid(path);
          parse->valid = (uint16_t)iVar2;
        }
        else {
          if (fmt->assign == '\0') {
            iVar2 = mpt_parse_ncheck(path->base + path->len + path->off,(ulong)parse->valid,
                                     (uint)(parse->name).opt);
            if (iVar2 < 0) {
              return -3;
            }
            iVar2 = mpt_path_add(path,(uint)parse->valid);
            if (iVar2 < 0) {
              return -0x11;
            }
            mpt_path_invalidate(path);
            parse->valid = 0;
            iVar2 = mpt_parse_data(fmt,parse,path);
            if (iVar2 < 0) {
              return iVar2;
            }
            if (iVar2 == 0) {
              return 3;
            }
            return 7;
          }
          if (local_2c == 10) {
            if ((fmt->oend != '\0') && (fmt->oend != '\n')) {
              return -2;
            }
            goto LAB_00126cd0;
          }
        }
        local_2c = mpt_parse_getchar(&parse->src,path);
      } while (-1 < (int)local_2c);
      fmt_local._4_4_ = -1;
      if (local_2c == 0xfffffffe) {
        fmt_local._4_4_ = -0x10;
      }
    }
  }
  else {
    parse->curr = '\v';
    fmt_local._4_4_ = -2;
  }
  return fmt_local._4_4_;
}

Assistant:

extern int mpt_parse_option(const MPT_STRUCT(parser_format) *fmt, MPT_STRUCT(parser_context) *parse, MPT_STRUCT(path) *path)
{
	int curr;
	
	/* get next visible character, no save */
	if ((curr = mpt_parse_nextvis(&parse->src, fmt->com, sizeof(fmt->com))) < 0) {
		parse->curr = parse->valid ? (MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name)) : MPT_PARSEFLAG(Option);
		if (curr != -2) {
			return MPT_ERROR(BadArgument);
		}
		return path->len ? MPT_ERROR(MissingData) : 0;
	}
	if (fmt->ostart && curr != fmt->ostart && parse->valid){
		parse->curr = MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name);
		return MPT_ERROR(BadValue);
	}
	if (mpt_path_addchar(path, curr) < 0) {
		parse->curr = MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name);
		return MPT_ERROR(MissingBuffer);
	}
	parse->curr = MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name);
	
	while (1) {
		/* option assign condition */
		if (isspace(curr)) {
			if (!fmt->assign) {
				if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.opt) < 0) {
					return MPT_ERROR(BadType);
				}
				if (mpt_path_add(path, parse->valid) < 0) {
					return MPT_ERROR(MissingBuffer);
				}
				/* clear trailing path data */
				mpt_path_invalidate(path);
				parse->valid = 0;
				
				if ((curr = mpt_parse_data(fmt, parse, path)) < 0) {
					return curr;
				}
				if (!curr) {
					return MPT_PARSEFLAG(Option);
				}
				return MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Data);
			}
			if (curr == '\n') {
				if (fmt->oend && curr != fmt->oend) {
					return MPT_ERROR(BadValue);
				}
				break;
			}
		}
		else if (curr == fmt->assign) {
			if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.opt) < 0) {
				return MPT_ERROR(BadType);
			}
			if (mpt_path_add(path, parse->valid) < 0) {
				return MPT_ERROR(MissingBuffer);
			}
			/* clear trailing path data */
			mpt_path_invalidate(path);
			parse->valid = 0;
			
			if ((curr = mpt_parse_data(fmt, parse, path)) < 0) {
				return curr;
			}
			if (!curr) {
				return MPT_PARSEFLAG(Option);
			}
			return MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Data);
		}
		/* option end detected */
		else if (curr == fmt->oend) {
			break;
		}
		/* comments: continue to line end without save */
		else if (MPT_iscomment(fmt, curr)) {
			if (fmt->oend) {
				return MPT_ERROR(BadValue);
			}
			(void) mpt_parse_endline(&parse->src);
			break;
		}
		else {
			parse->valid = mpt_path_valid(path);
		}
		if ((curr = mpt_parse_getchar(&parse->src, path)) < 0) {
			return (curr == -2) ? MPT_ERROR(MissingData) : MPT_ERROR(BadArgument);
		}
	}
	parse->curr = MPT_PARSEFLAG(Data);
	/* set zero length option name */
	if (!(parse->name.opt & MPT_NAMEFLAG(Empty))) {
		return MPT_ERROR(BadType);
	}
	return MPT_PARSEFLAG(Data);
}